

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

cmNinjaTargetGenerator * cmNinjaTargetGenerator::New(cmGeneratorTarget *target)

{
  uint uVar1;
  int iVar2;
  cmMakefile *this;
  char *__s1;
  char *__s2;
  cmNinjaTargetGenerator *this_00;
  cmMakefile *mf;
  cmGeneratorTarget *target_local;
  
  uVar1 = cmGeneratorTarget::GetType(target);
  if (uVar1 < 5) {
    target_local = (cmGeneratorTarget *)operator_new(0x1a8);
    cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
              ((cmNinjaNormalTargetGenerator *)target_local,target);
  }
  else if (uVar1 == 5) {
    target_local = (cmGeneratorTarget *)operator_new(0xe8);
    cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
              ((cmNinjaUtilityTargetGenerator *)target_local,target);
  }
  else {
    if (uVar1 == 6) {
      this = cmTarget::GetMakefile(target->Target);
      __s1 = cmMakefile::GetCurrentSourceDirectory(this);
      __s2 = cmMakefile::GetHomeDirectory(this);
      iVar2 = strcmp(__s1,__s2);
      if (iVar2 == 0) {
        this_00 = (cmNinjaTargetGenerator *)operator_new(0xe8);
        cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
                  ((cmNinjaUtilityTargetGenerator *)this_00,target);
        return this_00;
      }
    }
    target_local = (cmGeneratorTarget *)0x0;
  }
  return (cmNinjaTargetGenerator *)target_local;
}

Assistant:

cmNinjaTargetGenerator *
cmNinjaTargetGenerator::New(cmGeneratorTarget* target)
{
  switch (target->GetType())
    {
      case cmTarget::EXECUTABLE:
      case cmTarget::SHARED_LIBRARY:
      case cmTarget::STATIC_LIBRARY:
      case cmTarget::MODULE_LIBRARY:
      case cmTarget::OBJECT_LIBRARY:
        return new cmNinjaNormalTargetGenerator(target);

      case cmTarget::UTILITY:
        return new cmNinjaUtilityTargetGenerator(target);;

      case cmTarget::GLOBAL_TARGET: {
        // We only want to process global targets that live in the home
        // (i.e. top-level) directory.  CMake creates copies of these targets
        // in every directory, which we don't need.
        cmMakefile *mf = target->Target->GetMakefile();
        if (strcmp(mf->GetCurrentSourceDirectory(),
                   mf->GetHomeDirectory()) == 0)
          return new cmNinjaUtilityTargetGenerator(target);
        // else fallthrough
      }

      default:
        return 0;
    }
}